

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DebugNodeDrawCmdShowMeshAndBoundingBox
               (ImDrawList *out_draw_list,ImDrawList *draw_list,ImDrawCmd *draw_cmd,bool show_mesh,
               bool show_aabb)

{
  uint uVar1;
  uint uVar2;
  byte in_CL;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  byte in_R8B;
  int n;
  ImVec2 triangle [3];
  ImDrawVert *vtx_buffer;
  ImDrawIdx *idx_buffer;
  uint idx_end;
  uint idx_n;
  ImDrawListFlags backup_flags;
  ImRect vtxs_rect;
  ImRect clip_rect;
  float in_stack_000001a8;
  ImDrawFlags in_stack_000001ac;
  ImU32 in_stack_000001b0;
  int in_stack_000001b4;
  ImVec2 *in_stack_000001b8;
  ImDrawList *in_stack_000001c0;
  ImVec4 *in_stack_ffffffffffffff18;
  ImRect *in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  uint uVar3;
  ImVec2 *local_b0;
  ImVec2 *local_a8;
  int local_7c;
  ImVec2 local_78 [3];
  float in_stack_ffffffffffffffa0;
  float in_stack_ffffffffffffffa4;
  long in_stack_ffffffffffffffa8;
  ImVec2 *in_stack_ffffffffffffffb0;
  undefined4 uVar4;
  float in_stack_ffffffffffffffc4;
  
  ImRect::ImRect(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  ImRect::ImRect((ImRect *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                 (float)((ulong)in_stack_ffffffffffffff28 >> 0x20),(float)in_stack_ffffffffffffff28,
                 (float)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                 SUB84(in_stack_ffffffffffffff20,0));
  uVar4 = *(undefined4 *)(in_RDI + 0x30);
  *(uint *)(in_RDI + 0x30) = *(uint *)(in_RDI + 0x30) & 0xfffffffe;
  uVar2 = *(uint *)(in_RDX + 0x1c);
  uVar1 = *(int *)(in_RDX + 0x1c) + *(int *)(in_RDX + 0x20);
  while (uVar2 < uVar1) {
    if (*(int *)(in_RSI + 0x10) < 1) {
      local_a8 = (ImVec2 *)0x0;
    }
    else {
      local_a8 = *(ImVec2 **)(in_RSI + 0x18);
    }
    in_stack_ffffffffffffffa8 = *(long *)(in_RSI + 0x28) + (ulong)*(uint *)(in_RDX + 0x18) * 0x14;
    local_b0 = local_78;
    in_stack_ffffffffffffffb0 = local_a8;
    do {
      ImVec2::ImVec2(local_b0);
      local_b0 = local_b0 + 1;
    } while (local_b0 != (ImVec2 *)&stack0xffffffffffffffa0);
    for (local_7c = 0; local_7c < 3; local_7c = local_7c + 1) {
      uVar3 = uVar2;
      if (in_stack_ffffffffffffffb0 != (ImVec2 *)0x0) {
        uVar3 = (uint)*(ushort *)((long)&in_stack_ffffffffffffffb0->x + (ulong)uVar2 * 2);
      }
      local_78[local_7c] = *(ImVec2 *)(in_stack_ffffffffffffffa8 + (ulong)uVar3 * 0x14);
      ImRect::Add((ImRect *)&stack0xffffffffffffffc4,local_78 + local_7c);
      uVar2 = uVar2 + 1;
    }
    if ((in_CL & 1) != 0) {
      ImDrawList::AddPolyline
                (in_stack_000001c0,in_stack_000001b8,in_stack_000001b4,in_stack_000001b0,
                 in_stack_000001ac,in_stack_000001a8);
    }
  }
  if ((in_R8B & 1) != 0) {
    ImFloor((ImVec2 *)in_stack_ffffffffffffff18);
    ImFloor((ImVec2 *)in_stack_ffffffffffffff18);
    ImDrawList::AddRect((ImDrawList *)CONCAT44(in_stack_ffffffffffffffc4,uVar4),
                        (ImVec2 *)CONCAT44(uVar2,uVar1),in_stack_ffffffffffffffb0,
                        (ImU32)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                        (float)in_stack_ffffffffffffffa8,(ImDrawFlags)in_stack_ffffffffffffffa4,
                        in_stack_ffffffffffffffa0);
    ImFloor((ImVec2 *)in_stack_ffffffffffffff18);
    ImFloor((ImVec2 *)in_stack_ffffffffffffff18);
    ImDrawList::AddRect((ImDrawList *)CONCAT44(in_stack_ffffffffffffffc4,uVar4),
                        (ImVec2 *)CONCAT44(uVar2,uVar1),in_stack_ffffffffffffffb0,
                        (ImU32)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                        (float)in_stack_ffffffffffffffa8,(ImDrawFlags)in_stack_ffffffffffffffa4,
                        in_stack_ffffffffffffffa0);
  }
  *(undefined4 *)(in_RDI + 0x30) = uVar4;
  return;
}

Assistant:

void ImGui::DebugNodeDrawCmdShowMeshAndBoundingBox(ImDrawList* out_draw_list, const ImDrawList* draw_list, const ImDrawCmd* draw_cmd, bool show_mesh, bool show_aabb)
{
    IM_ASSERT(show_mesh || show_aabb);

    // Draw wire-frame version of all triangles
    ImRect clip_rect = draw_cmd->ClipRect;
    ImRect vtxs_rect(FLT_MAX, FLT_MAX, -FLT_MAX, -FLT_MAX);
    ImDrawListFlags backup_flags = out_draw_list->Flags;
    out_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines is more readable for very large and thin triangles.
    for (unsigned int idx_n = draw_cmd->IdxOffset, idx_end = draw_cmd->IdxOffset + draw_cmd->ElemCount; idx_n < idx_end; )
    {
        ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL; // We don't hold on those pointers past iterations as ->AddPolyline() may invalidate them if out_draw_list==draw_list
        ImDrawVert* vtx_buffer = draw_list->VtxBuffer.Data + draw_cmd->VtxOffset;

        ImVec2 triangle[3];
        for (int n = 0; n < 3; n++, idx_n++)
            vtxs_rect.Add((triangle[n] = vtx_buffer[idx_buffer ? idx_buffer[idx_n] : idx_n].pos));
        if (show_mesh)
            out_draw_list->AddPolyline(triangle, 3, IM_COL32(255, 255, 0, 255), ImDrawFlags_Closed, 1.0f); // In yellow: mesh triangles
    }
    // Draw bounding boxes
    if (show_aabb)
    {
        out_draw_list->AddRect(ImFloor(clip_rect.Min), ImFloor(clip_rect.Max), IM_COL32(255, 0, 255, 255)); // In pink: clipping rectangle submitted to GPU
        out_draw_list->AddRect(ImFloor(vtxs_rect.Min), ImFloor(vtxs_rect.Max), IM_COL32(0, 255, 255, 255)); // In cyan: bounding box of triangles
    }
    out_draw_list->Flags = backup_flags;
}